

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-monster.c
# Opt level: O2

_Bool mon_restrict(char *monster_type,wchar_t depth,wchar_t current_depth,_Bool unique_ok)

{
  wchar_t wVar1;
  int iVar2;
  _Bool _Var3;
  int iVar4;
  uint32_t uVar5;
  long lVar6;
  char *src;
  int iVar7;
  uint uVar8;
  pit_profile **pppVar9;
  code *get_mon_num_hook;
  
  allow_unique = unique_ok;
  for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
    base_d_char[lVar6] = '\0';
  }
  select_current_level = current_depth;
  if (monster_type == (char *)0x0) {
    get_mon_num_hook = (_func__Bool_monster_race_ptr *)0x0;
  }
  else {
    iVar4 = strcmp(monster_type,"random");
    if (iVar4 == 0) {
      uVar8 = 0;
      do {
        if (uVar8 == 0x9c4) {
          return false;
        }
        uVar5 = Rand_div(z_info->r_max - 1);
        iVar4 = uVar5 + 1;
        if (r_info[iVar4].rarity != L'\0') {
          _Var3 = flag_has_dbg(r_info[iVar4].flags,0xc,1,"r_info[j].flags","RF_UNIQUE");
          if (uVar8 < 200) {
            if ((!_Var3) && (wVar1 = r_info[iVar4].level, wVar1 <= depth && wVar1 != L'\0')) {
              iVar7 = wVar1 - current_depth;
              iVar2 = -iVar7;
              if (0 < iVar7) {
                iVar2 = iVar7;
              }
              if (iVar2 <= current_depth / 4) goto LAB_0014d049;
            }
          }
          else if ((!_Var3) && (r_info[iVar4].level != L'\0' && r_info[iVar4].level <= depth)) {
            if (uVar8 == 0x9c3) {
              return false;
            }
LAB_0014d049:
            src = format("%c",(ulong)(uint)(r_info[iVar4].base)->d_char);
            my_strcpy(base_d_char,src,0xf);
            get_mon_num_hook = mon_select;
            goto LAB_0014cf4e;
          }
        }
        uVar8 = uVar8 + 1;
      } while( true );
    }
    pppVar9 = &pit_info;
    do {
      pppVar9 = &((pit_profile *)pppVar9)->next->next;
      if ((pit_profile *)pppVar9 == (pit_profile *)0x0) {
        return false;
      }
    } while ((((pit_profile *)pppVar9)->name == (char *)0x0) ||
            (iVar4 = strcmp(monster_type,((pit_profile *)pppVar9)->name), iVar4 != 0));
    dun->pit_type = (pit_profile *)pppVar9;
    get_mon_num_hook = mon_pit_hook;
  }
LAB_0014cf4e:
  get_mon_num_prep(get_mon_num_hook);
  return true;
}

Assistant:

bool mon_restrict(const char *monster_type, int depth, int current_depth,
		bool unique_ok)
{
	int i, j = 0;

	/* Clear global monster restriction variables. */
	allow_unique = unique_ok;
	for (i = 0; i < 10; i++)
		base_d_char[i] = '\0';
        select_current_level = current_depth;

	/* No monster type specified, no restrictions. */
	if (monster_type == NULL) {
		get_mon_num_prep(NULL);
		return true;
	} else if (streq(monster_type, "random")) {
		/* Handle random */
		for (i = 0; i < 2500; i++) {
			/* Get a random monster. */
			j = randint1(z_info->r_max - 1);

			/* Must be a real monster */
			if (!r_info[j].rarity)
				continue;

			/* Try for close to depth, accept in-depth if necessary */
			if (i < 200) {
				if ((!rf_has(r_info[j].flags, RF_UNIQUE))
					&& (r_info[j].level != 0) && (r_info[j].level <= depth)
					&& (ABS(r_info[j].level - current_depth) <
						1 + (current_depth / 4)))
					break;
			} else {
				if ((!rf_has(r_info[j].flags, RF_UNIQUE))
					&& (r_info[j].level != 0) && (r_info[j].level <= depth))
					break;
			}
		}

		/* We've found a monster. */
		if (i < 2499) {
			/* Use that monster's base type for all monsters. */
			my_strcpy(base_d_char, format("%c", r_info[j].base->d_char),
				sizeof(base_d_char));

			/* Prepare allocation table */
			get_mon_num_prep(mon_select);
			return true;
		} else
			/* Paranoia - area stays empty if no monster is found */
			return false;
	} else {
		/* Use a pit profile */
		struct pit_profile *profile = lookup_pit_profile(monster_type);

		/* Accept the profile or leave area empty if none found */
		if (profile)
			dun->pit_type = profile;
		else
			return false;

		/* Prepare allocation table */
		get_mon_num_prep(mon_pit_hook);
		return true;
	}
}